

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

Var __thiscall Minisat::Solver::newVar(Solver *this,lbool upol,bool dvar)

{
  int iVar1;
  Size SVar2;
  int *piVar3;
  VarData val;
  double local_78;
  int local_28;
  int local_24;
  int local_20;
  byte local_19;
  Var v;
  bool dvar_local;
  Solver *this_local;
  lbool upol_local;
  
  local_19 = dvar;
  _v = this;
  this_local._7_1_ = upol.value;
  SVar2 = vec<int,_int>::size(&this->free_vars);
  if (SVar2 < 1) {
    local_20 = this->next_var;
    this->next_var = local_20 + 1;
  }
  else {
    piVar3 = vec<int,_int>::last(&this->free_vars);
    local_20 = *piVar3;
    vec<int,_int>::pop(&this->free_vars);
  }
  local_24 = (int)mkLit(local_20,false);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::init(&this->watches,(EVP_PKEY_CTX *)&local_24);
  local_28 = (int)mkLit(local_20,true);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::init(&this->watches,(EVP_PKEY_CTX *)&local_28);
  IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,
             local_20,l_Undef);
  iVar1 = local_20;
  val = mkVarData(0xffffffff,0);
  IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->vardata).
              super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>,iVar1,val);
  iVar1 = local_20;
  if ((this->rnd_init_act & 1U) == 0) {
    local_78 = 0.0;
  }
  else {
    local_78 = drand(&this->random_seed);
    local_78 = local_78 * 1e-05;
  }
  IntMap<int,_double,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>,iVar1,
             local_78);
  IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,local_20,'\0');
  IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,local_20,
             '\x01');
  IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::insert
            (&(this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,
             local_20,this_local._7_1_);
  IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::reserve
            (&(this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,local_20);
  vec<Minisat::Lit,_int>::capacity(&this->trail,local_20 + 1);
  setDecisionVar(this,local_20,(bool)(local_19 & 1));
  return local_20;
}

Assistant:

Var Solver::newVar(lbool upol, bool dvar)
{
    Var v;
    if (free_vars.size() > 0){
        v = free_vars.last();
        free_vars.pop();
    }else
        v = next_var++;

    watches  .init(mkLit(v, false));
    watches  .init(mkLit(v, true ));
    assigns  .insert(v, l_Undef);
    vardata  .insert(v, mkVarData(CRef_Undef, 0));
    activity .insert(v, rnd_init_act ? drand(random_seed) * 0.00001 : 0);
    seen     .insert(v, 0);
    polarity .insert(v, true);
    user_pol .insert(v, upol);
    decision .reserve(v);
    trail    .capacity(v+1);
    setDecisionVar(v, dvar);
    return v;
}